

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_common.c
# Opt level: O0

void CP_dumpParams(SstStream Stream,_SstParams *Params,int ReaderSide)

{
  char *pcVar1;
  int in_EDX;
  long *in_RSI;
  long in_RDI;
  char *local_68;
  char *local_58;
  char *local_48;
  char *local_38;
  char *local_28;
  
  if (1 < *(int *)(in_RDI + 0x1c)) {
    fprintf(_stderr,"Param -   RegistrationMethod=%s\n",SstRegStr[in_RSI[2]]);
    if (in_EDX == 0) {
      fprintf(_stderr,"Param -   RendezvousReaderCount=%d\n",(ulong)*(uint *)((long)in_RSI + 0x34));
      pcVar1 = "";
      if ((int)in_RSI[7] == 0) {
        pcVar1 = "(unlimited)";
      }
      fprintf(_stderr,"Param -   QueueLimit=%d %s\n",(ulong)*(uint *)(in_RSI + 7),pcVar1);
      fprintf(_stderr,"Param -   QueueFullPolicy=%s\n",SstQueueFullStr[in_RSI[8]]);
      fprintf(_stderr,"Param -   StepDistributionMode=%s\n",SstStepDistributionModeStr[in_RSI[3]]);
    }
    if (in_RSI[4] == 0) {
      local_28 = "";
    }
    else {
      local_28 = (char *)in_RSI[4];
    }
    fprintf(_stderr,"Param -   DataTransport=%s\n",local_28);
    fprintf(_stderr,"Param -   ControlTransport=%s\n",in_RSI[10]);
    if (in_RSI[0xb] == 0) {
      local_38 = "(default)";
    }
    else {
      local_38 = (char *)in_RSI[0xb];
    }
    fprintf(_stderr,"Param -   NetworkInterface=%s\n",local_38);
    if (in_RSI[0xc] == 0) {
      local_48 = "(default to NetworkInterface if applicable)";
    }
    else {
      local_48 = (char *)in_RSI[0xc];
    }
    fprintf(_stderr,"Param -   ControlInterface=%s\n",local_48);
    if (in_RSI[0xd] == 0) {
      local_58 = "(default to NetworkInterface if applicable)";
    }
    else {
      local_58 = (char *)in_RSI[0xd];
    }
    fprintf(_stderr,"Param -   DataInterface=%s\n",local_58);
    if (in_EDX == 0) {
      fprintf(_stderr,"Param -   CompressionMethod=%s\n",SstCompressStr[in_RSI[0xf]]);
      fprintf(_stderr,"Param -   CPCommPattern=%s\n",SstCommPatternStr[in_RSI[0xe]]);
      fprintf(_stderr,"Param -   MarshalMethod=%s\n",SstMarshalStr[*in_RSI]);
      pcVar1 = "False";
      if (*(int *)((long)in_RSI + 0x4c) != 0) {
        pcVar1 = "True";
      }
      fprintf(_stderr,"Param -   FirstTimestepPrecious=%s\n",pcVar1);
      fprintf(_stderr,"Param -   IsRowMajor=%d  (not user settable) \n",(ulong)*(uint *)(in_RSI + 9)
             );
    }
    if (in_EDX != 0) {
      pcVar1 = "False";
      if ((int)in_RSI[0x10] != 0) {
        pcVar1 = "True";
      }
      fprintf(_stderr,"Param -   AlwaysProvideLatestTimestep=%s\n",pcVar1);
    }
    fprintf(_stderr,"Param -   OpenTimeoutSecs=%d (seconds)\n",(ulong)*(uint *)(in_RSI + 6));
    fprintf(_stderr,"Param -   SpeculativePreloadMode=%s\n",
            SstPreloadModeStr[*(int *)((long)in_RSI + 0x84)]);
    fprintf(_stderr,"Param -   SpecAutoNodeThreshold=%d\n",(ulong)*(uint *)(in_RSI + 0x11));
    if (in_RSI[0x14] == 0) {
      local_68 = " (default - Advanced param)";
    }
    else {
      local_68 = (char *)in_RSI[0x14];
    }
    fprintf(_stderr,"Param -   ControlModule=%s\n",local_68);
  }
  return;
}

Assistant:

extern void CP_dumpParams(SstStream Stream, struct _SstParams *Params, int ReaderSide)
{
    if (Stream->CPVerbosityLevel < SummaryVerbose)
        return;

    fprintf(stderr, "Param -   RegistrationMethod=%s\n", SstRegStr[Params->RegistrationMethod]);
    if (!ReaderSide)
    {
        fprintf(stderr, "Param -   RendezvousReaderCount=%d\n", Params->RendezvousReaderCount);
        fprintf(stderr, "Param -   QueueLimit=%d %s\n", Params->QueueLimit,
                (Params->QueueLimit == 0) ? "(unlimited)" : "");
        fprintf(stderr, "Param -   QueueFullPolicy=%s\n", SstQueueFullStr[Params->QueueFullPolicy]);
        fprintf(stderr, "Param -   StepDistributionMode=%s\n",
                SstStepDistributionModeStr[Params->StepDistributionMode]);
    }
    fprintf(stderr, "Param -   DataTransport=%s\n",
            Params->DataTransport ? Params->DataTransport : "");
    fprintf(stderr, "Param -   ControlTransport=%s\n", Params->ControlTransport);
    fprintf(stderr, "Param -   NetworkInterface=%s\n",
            Params->NetworkInterface ? Params->NetworkInterface : "(default)");
    fprintf(stderr, "Param -   ControlInterface=%s\n",
            Params->ControlInterface ? Params->ControlInterface
                                     : "(default to NetworkInterface if applicable)");
    fprintf(stderr, "Param -   DataInterface=%s\n",
            Params->DataInterface ? Params->DataInterface
                                  : "(default to NetworkInterface if applicable)");
    if (!ReaderSide)
    {
        fprintf(stderr, "Param -   CompressionMethod=%s\n",
                SstCompressStr[Params->CompressionMethod]);
        fprintf(stderr, "Param -   CPCommPattern=%s\n", SstCommPatternStr[Params->CPCommPattern]);
        fprintf(stderr, "Param -   MarshalMethod=%s\n", SstMarshalStr[Params->MarshalMethod]);
        fprintf(stderr, "Param -   FirstTimestepPrecious=%s\n",
                Params->FirstTimestepPrecious ? "True" : "False");
        fprintf(stderr, "Param -   IsRowMajor=%d  (not user settable) \n", Params->IsRowMajor);
    }
    if (ReaderSide)
    {
        fprintf(stderr, "Param -   AlwaysProvideLatestTimestep=%s\n",
                Params->AlwaysProvideLatestTimestep ? "True" : "False");
    }
    fprintf(stderr, "Param -   OpenTimeoutSecs=%d (seconds)\n", Params->OpenTimeoutSecs);
    fprintf(stderr, "Param -   SpeculativePreloadMode=%s\n",
            SstPreloadModeStr[Params->SpeculativePreloadMode]);
    fprintf(stderr, "Param -   SpecAutoNodeThreshold=%d\n", Params->SpecAutoNodeThreshold);
    fprintf(stderr, "Param -   ControlModule=%s\n",
            Params->ControlModule ? Params->ControlModule : " (default - Advanced param)");
}